

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O0

uint64 HashLen0to16(char *s,size_t len)

{
  uint64 uVar1;
  uint64 uVar2;
  ulong in_RSI;
  byte *in_RDI;
  uint32 z;
  uint32 y;
  uint8 c;
  uint8 b_1;
  uint8 a_2;
  uint64 a_1;
  uint64 b;
  uint64 a;
  uint64 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ulong local_8;
  
  if (in_RSI < 9) {
    if (in_RSI < 4) {
      if (in_RSI == 0) {
        local_8 = 0x9ae16a3b2f90404f;
      }
      else {
        uVar1 = ShiftMix((ulong)((uint)*in_RDI + (uint)in_RDI[in_RSI >> 1] * 0x100) *
                         -0x651e95c4d06fbfb1 ^
                         (ulong)((int)in_RSI + (uint)in_RDI[in_RSI - 1] * 4) * -0x36b62838af619aa9);
        local_8 = uVar1 * -0x651e95c4d06fbfb1;
      }
    }
    else {
      Fetch32((char *)0x1b01fb);
      Fetch32((char *)0x1b022b);
      local_8 = HashLen16(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
    }
  }
  else {
    uVar1 = Fetch64((char *)0x1b0190);
    uVar2 = Fetch64((char *)0x1b01a8);
    RotateByAtLeast1(uVar2 + in_RSI,(int)in_RSI);
    uVar1 = HashLen16(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar1);
    local_8 = uVar1 ^ uVar2;
  }
  return local_8;
}

Assistant:

static uint64 HashLen0to16(const char *s, size_t len) {
  if (len > 8) {
    uint64 a = Fetch64(s);
    uint64 b = Fetch64(s + len - 8);
    return HashLen16(a, RotateByAtLeast1(b + len, len)) ^ b;
  }
  if (len >= 4) {
    uint64 a = Fetch32(s);
    return HashLen16(len + (a << 3), Fetch32(s + len - 4));
  }
  if (len > 0) {
    uint8 a = s[0];
    uint8 b = s[len >> 1];
    uint8 c = s[len - 1];
    uint32 y = static_cast<uint32>(a) + (static_cast<uint32>(b) << 8);
    uint32 z = len + (static_cast<uint32>(c) << 2);
    return ShiftMix(y * k2 ^ z * k3) * k2;
  }
  return k2;
}